

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O0

void __thiscall VCCluster::VCCluster(VCCluster *this,int id)

{
  undefined4 in_ESI;
  DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *in_RDI;
  undefined4 in_stack_fffffffffffffff0;
  
  *(undefined ***)in_RDI = &PTR_addItemAdditionalAct_00399b50;
  *(undefined4 *)(in_RDI + 8) = in_ESI;
  std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>::set
            ((set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> *)0x27da05);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
             (Scalar *)0x0,(Scalar *)0x0,(Scalar *)0x0);
  *(undefined8 *)(in_RDI + 0x58) = 0;
  in_RDI[0x60] = (DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>)0x0;
  Eigen::Matrix<double,_4,_4,_0,_4,_4>::Matrix((Matrix<double,_4,_4,_0,_4,_4> *)0x27da59);
  Eigen::DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::setZero(in_RDI);
  return;
}

Assistant:

VCCluster::VCCluster(int id):id(id), area(0), isNull(false), weightedSum(0,0,0)
{
	E.setZero();
}